

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_push_promise_received(nghttp2_session *session,nghttp2_frame *frame)

{
  uint stream_id;
  int32_t stream_id_00;
  int iVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  char *reason;
  nghttp2_priority_spec pri_spec;
  
  stream_id = (frame->hd).stream_id;
  if (stream_id == 0) {
    reason = "PUSH_PROMISE: stream_id == 0";
  }
  else if ((session->server == '\0') && ((session->local_settings).enable_push != 0)) {
    if ((stream_id & 1) == 0) {
      reason = "PUSH_PROMISE: invalid stream_id";
    }
    else {
      if ((session->goaway_flags & 5) != 0) {
        return -0x67;
      }
      stream_id_00 = (frame->push_promise).promised_stream_id;
      iVar1 = session_is_new_peer_stream_id(session,stream_id_00);
      if (iVar1 == 0) {
        reason = "PUSH_PROMISE: invalid promised_stream_id";
      }
      else {
        iVar1 = session_detect_idle_stream(session,stream_id);
        if (iVar1 == 0) {
          session->last_recv_stream_id = stream_id_00;
          pnVar3 = nghttp2_session_get_stream(session,(frame->hd).stream_id);
          if ((((pnVar3 == (nghttp2_stream *)0x0) || (pnVar3->state == NGHTTP2_STREAM_CLOSING)) ||
              (session->pending_enable_push == '\0')) ||
             (session->max_incoming_reserved_streams <= session->num_incoming_reserved_streams)) {
            iVar2 = nghttp2_session_add_rst_stream
                              (session,(frame->push_promise).promised_stream_id,8);
            iVar1 = -0x67;
            if (iVar2 != 0) {
              iVar1 = iVar2;
            }
            return iVar1;
          }
          if ((pnVar3->shut_flags & 1) == 0) {
            nghttp2_priority_spec_init(&pri_spec,pnVar3->stream_id,0x10,0);
            pnVar3 = nghttp2_session_open_stream
                               (session,(frame->push_promise).promised_stream_id,'\0',&pri_spec,
                                NGHTTP2_STREAM_RESERVED,(void *)0x0);
            if (pnVar3 != (nghttp2_stream *)0x0) {
              session->last_proc_stream_id = session->last_recv_stream_id;
              iVar1 = session_call_on_begin_headers(session,frame);
              return iVar1;
            }
            return -0x385;
          }
          reason = "PUSH_PROMISE: stream closed";
          iVar1 = -0x1fe;
          goto LAB_0053ad13;
        }
        reason = "PUSH_PROMISE: stream in idle";
      }
    }
  }
  else {
    reason = "PUSH_PROMISE: push disabled";
  }
  iVar1 = -0x1f9;
LAB_0053ad13:
  iVar1 = session_inflate_handle_invalid_connection(session,frame,iVar1,reason);
  return iVar1;
}

Assistant:

int nghttp2_session_on_push_promise_received(nghttp2_session *session,
                                             nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_stream *promised_stream;
  nghttp2_priority_spec pri_spec;

  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: stream_id == 0");
  }
  if (session->server || session->local_settings.enable_push == 0) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: push disabled");
  }

  if (!nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: invalid stream_id");
  }

  if (!session_allow_incoming_new_stream(session)) {
    /* We just discard PUSH_PROMISE after GOAWAY was sent */
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (!session_is_new_peer_stream_id(session,
                                     frame->push_promise.promised_stream_id)) {
    /* The spec says if an endpoint receives a PUSH_PROMISE with
       illegal stream ID is subject to a connection error of type
       PROTOCOL_ERROR. */
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "PUSH_PROMISE: invalid promised_stream_id");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: stream in idle");
  }

  session->last_recv_stream_id = frame->push_promise.promised_stream_id;
  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream || stream->state == NGHTTP2_STREAM_CLOSING ||
      !session->pending_enable_push ||
      session->num_incoming_reserved_streams >=
          session->max_incoming_reserved_streams) {
    /* Currently, client does not retain closed stream, so we don't
       check NGHTTP2_SHUT_RD condition here. */

    rv = nghttp2_session_add_rst_stream(
        session, frame->push_promise.promised_stream_id, NGHTTP2_CANCEL);
    if (rv != 0) {
      return rv;
    }
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_STREAM_CLOSED,
        "PUSH_PROMISE: stream closed");
  }

  nghttp2_priority_spec_init(&pri_spec, stream->stream_id,
                             NGHTTP2_DEFAULT_WEIGHT, 0);

  promised_stream = nghttp2_session_open_stream(
      session, frame->push_promise.promised_stream_id, NGHTTP2_STREAM_FLAG_NONE,
      &pri_spec, NGHTTP2_STREAM_RESERVED, NULL);

  if (!promised_stream) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't call nghttp2_session_adjust_closed_stream(), since we
     don't keep closed stream in client side */

  session->last_proc_stream_id = session->last_recv_stream_id;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}